

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_zstd.c
# Opt level: O0

void test_option_zstd(void)

{
  wchar_t wVar1;
  char *pcVar2;
  ulong local_20;
  size_t s;
  char *pcStack_10;
  int r;
  char *p;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  s._4_4_ = systemf("%s -cf - --zstd f >archive.out 2>archive.err",testprog);
  pcStack_10 = slurpfile(&local_20,"archive.err");
  pcStack_10[local_20] = '\0';
  if (s._4_4_ == L'\0') {
    free(pcStack_10);
    pcStack_10 = slurpfile(&local_20,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                     ,L'=',(uint)(2 < local_20),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                        ,L'>',pcStack_10,"p",anon_var_dwarf_c608,"\"\\x28\\xb5\\x2f\\xfd\"",4,"4",
                        (void *)0x0);
  }
  else {
    pcVar2 = strstr(pcStack_10,"Unsupported compression");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(pcStack_10,"Can\'t launch");
      if ((pcVar2 == (char *)0x0) || (wVar1 = canZstd(), wVar1 != L'\0')) {
        pcVar2 = strstr(pcStack_10,"Can\'t write");
        if ((pcVar2 == (char *)0x0) || (wVar1 = canZstd(), wVar1 != L'\0')) {
          pcVar2 = strstr(pcStack_10,"Error closing");
          if ((pcVar2 != (char *)0x0) && (wVar1 = canZstd(), wVar1 == L'\0')) {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                           ,L'2');
            test_skipping(
                         "This version of bsdcpio uses an external zstd program but no such program is available on this system."
                         );
            return;
          }
          failure("--zstd option is broken: %s",pcStack_10);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                              ,L'7',(long)s._4_4_,"r",0,"0",(void *)0x0);
        }
        else {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                         ,L'+');
          test_skipping(
                       "This version of bsdtar uses an external zstd program but no such program is available on this system."
                       );
        }
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                       ,L'\"');
        test_skipping(
                     "This version of bsdtar uses an external zstd program but no such program is available on this system."
                     );
      }
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_zstd.c"
                     ,L'\x19');
      test_skipping("This version of bsdtar was compiled without zstd support");
    }
  }
  free(pcStack_10);
  return;
}

Assistant:

DEFINE_TEST(test_option_zstd)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with lz4 compression. */
	r = systemf("%s -cf - --zstd f >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "Unsupported compression") != NULL) {
			skipping("This version of bsdtar was compiled "
			    "without zstd support");
			goto done;
		}
		/* POSIX permits different handling of the spawnp
		 * system call used to launch the subsidiary
		 * program: */
		/* Some systems fail immediately to spawn the new process. */
		if (strstr(p, "Can't launch") != NULL && !canZstd()) {
			skipping("This version of bsdtar uses an external zstd program "
			    "but no such program is available on this system.");
			goto done;
		}
		/* Some systems successfully spawn the new process,
		 * but fail to exec a program within that process.
		 * This results in failure at the first attempt to
		 * write. */
		if (strstr(p, "Can't write") != NULL && !canZstd()) {
			skipping("This version of bsdtar uses an external zstd program "
			    "but no such program is available on this system.");
			goto done;
		}
		/* On some systems the error won't be detected until closing
		   time, by a 127 exit error returned by waitpid. */
		if (strstr(p, "Error closing") != NULL && !canZstd()) {
			skipping("This version of bsdcpio uses an external zstd program "
			    "but no such program is available on this system.");
			return;
		}
		failure("--zstd option is broken: %s", p);
		assertEqualInt(r, 0);
		goto done;
	}
	free(p);
	/* Check that the archive file has an lz4 signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x28\xb5\x2f\xfd", 4);

done:
	free(p);
}